

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

size_t __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::num_simplices_and_filtration_serialization_size
          (Simplex_tree<Simplex_tree_vec_fil> *this,Siblings *sib,size_t *fv_byte_size)

{
  bool bVar1;
  Dictionary *this_00;
  pointer ppVar2;
  Filtration_value *value;
  size_t sVar3;
  Siblings *sib_00;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_48;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_40;
  const_iterator sh;
  size_t simplices_number;
  const_iterator sib_end;
  const_iterator sib_begin;
  size_t *fv_byte_size_local;
  Siblings *sib_local;
  Simplex_tree<Simplex_tree_vec_fil> *this_local;
  
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>_>
  ::members(sib);
  boost::container::
  flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>
  ::begin((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>
           *)&sib_end);
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>_>
  ::members(sib);
  boost::container::
  flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>
  ::end((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>
         *)&simplices_number);
  this_00 = Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>_>
            ::members(sib);
  sh.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
              *)boost::container::
                flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>
                ::size(this_00);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  ::vec_iterator(&local_40,&sib_end);
  while (bVar1 = boost::container::operator!=
                           (&local_40,
                            (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
                             *)&simplices_number), bVar1) {
    ppVar2 = boost::container::
             vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
             ::operator->(&local_40);
    value = Filtration_simplex_base_real::filtration
                      (&(ppVar2->second).super_Filtration_simplex_base);
    sVar3 = get_serialization_size_of(value);
    *fv_byte_size = sVar3 + *fv_byte_size;
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
    ::vec_iterator(&local_48,&local_40);
    bVar1 = has_children<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>>*,true>>
                      (this,&local_48);
    if (bVar1) {
      ppVar2 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
               ::operator->(&local_40);
      sib_00 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>::
               children(&ppVar2->second);
      sVar3 = num_simplices_and_filtration_serialization_size(this,sib_00,fv_byte_size);
      sh.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
                  *)((long)&(sh.m_ptr)->first + sVar3);
    }
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
    ::operator++(&local_40);
  }
  return (size_t)sh.m_ptr;
}

Assistant:

std::size_t num_simplices_and_filtration_serialization_size(Siblings const* sib, std::size_t& fv_byte_size) const {
    using namespace Gudhi::simplex_tree;
    
    auto sib_begin = sib->members().begin();
    auto sib_end = sib->members().end();
    size_t simplices_number = sib->members().size();
    for (auto sh = sib_begin; sh != sib_end; ++sh) {
      if constexpr (SimplexTreeOptions::store_filtration)
        fv_byte_size += get_serialization_size_of(sh->second.filtration());
      if (has_children(sh)) {
        simplices_number += num_simplices_and_filtration_serialization_size(sh->second.children(), fv_byte_size);
      }
    }
    return simplices_number;
  }